

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O0

void __thiscall bgui::ImageWindow::onKey(ImageWindow *this,char c,SpecialKey key,int x,int y)

{
  long *plVar1;
  byte bVar2;
  bool bVar3;
  mapping mVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  char *pcVar10;
  int in_ECX;
  int in_EDX;
  char in_SIL;
  long *in_RDI;
  int in_R8D;
  int h_5;
  int w_5;
  int h_4;
  int w_4;
  int y_2;
  int x_2;
  int h_3;
  int w_3;
  int y_1;
  int x_1;
  ostringstream out;
  double v_1;
  int h_2;
  int w_2;
  double v;
  int h_1;
  int w_1;
  int h;
  int w;
  int in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  BaseWindow *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  BaseWindow *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined1 uVar11;
  ImageWindow *in_stack_fffffffffffffd70;
  ImageWindow *this_00;
  undefined8 in_stack_fffffffffffffd88;
  ImageAdapterBase *in_stack_fffffffffffffd90;
  int local_20c;
  int local_208;
  int local_204;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  string local_1e8 [48];
  ostringstream local_1b8 [376];
  double local_40;
  int local_38;
  int local_34;
  double local_30;
  int local_28;
  int local_24;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  *(char *)(in_RDI + 8) = in_SIL;
  if ((in_SIL != 'h') && (in_SIL != 'v')) {
    BaseWindow::setInfoText
              (&in_stack_fffffffffffffd70->super_BaseWindow,
               (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  }
  switch(in_SIL) {
  case '+':
    (**(code **)(*in_RDI + 0x18))(in_RDI,3,in_ECX,in_R8D,8);
    break;
  case '-':
    (**(code **)(*in_RDI + 0x18))(in_RDI,4,in_ECX,in_R8D,0x10);
    break;
  case '0':
    if (in_RDI[2] != 0) {
      ImageAdapterBase::setScale((ImageAdapterBase *)in_RDI[2],1.0);
      redrawImage(in_stack_fffffffffffffd70,SUB41((uint)in_stack_fffffffffffffd6c >> 0x18,0));
      updateInfo((ImageWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    break;
  case '1':
  case '2':
  case '4':
    if (in_RDI[2] != 0) {
      ImageAdapterBase::setGamma((ImageAdapterBase *)in_RDI[2],(double)(in_SIL + -0x30));
      redrawImage(in_stack_fffffffffffffd70,SUB41((uint)in_stack_fffffffffffffd6c >> 0x18,0));
      updateInfo((ImageWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    break;
  case 'B':
    if (in_RDI[2] != 0) {
      ImageAdapterBase::setChannel((ImageAdapterBase *)in_RDI[2],2);
    }
    redrawImage(in_stack_fffffffffffffd70,SUB41((uint)in_stack_fffffffffffffd6c >> 0x18,0));
    break;
  case 'C':
    if (in_RDI[2] != 0) {
      ImageAdapterBase::setChannel((ImageAdapterBase *)in_RDI[2],-1);
    }
    redrawImage(in_stack_fffffffffffffd70,SUB41((uint)in_stack_fffffffffffffd6c >> 0x18,0));
    break;
  case 'G':
    if (in_RDI[2] != 0) {
      ImageAdapterBase::setChannel((ImageAdapterBase *)in_RDI[2],1);
    }
    redrawImage(in_stack_fffffffffffffd70,SUB41((uint)in_stack_fffffffffffffd6c >> 0x18,0));
    break;
  case 'R':
    if (in_RDI[2] != 0) {
      ImageAdapterBase::setChannel((ImageAdapterBase *)in_RDI[2],0);
    }
    redrawImage(in_stack_fffffffffffffd70,SUB41((uint)in_stack_fffffffffffffd6c >> 0x18,0));
    break;
  case 'a':
    if (in_RDI[2] != 0) {
      BaseWindow::getSize(in_stack_fffffffffffffd60,
                          (int *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                          (int *)in_stack_fffffffffffffd50);
      uVar11 = (undefined1)((uint)in_stack_fffffffffffffd6c >> 0x18);
      (**(code **)(*(long *)in_RDI[2] + 0x20))
                ((long *)in_RDI[2],(long)*(int *)((long)in_RDI + 0x44),(long)(int)in_RDI[9],
                 (long)in_stack_ffffffffffffffe4,(long)in_stack_ffffffffffffffe0);
      redrawImage(in_stack_fffffffffffffd70,(bool)uVar11);
      updateInfo((ImageWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    break;
  case 'b':
    if (in_RDI[2] != 0) {
      BaseWindow::getSize(in_stack_fffffffffffffd60,
                          (int *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                          (int *)in_stack_fffffffffffffd50);
      uVar11 = (undefined1)((uint)in_stack_fffffffffffffd6c >> 0x18);
      if ((((-1 < in_ECX + *(int *)((long)in_RDI + 0x44)) &&
           (iVar6 = *(int *)((long)in_RDI + 0x44),
           lVar7 = (**(code **)(*(long *)in_RDI[2] + 0x58))(), in_ECX + iVar6 < lVar7)) &&
          (-1 < in_ECX)) &&
         (((in_ECX < local_24 && (-1 < in_R8D + (int)in_RDI[9])) &&
          ((lVar7 = in_RDI[9], lVar8 = (**(code **)(*(long *)in_RDI[2] + 0x60))(),
           in_R8D + (int)lVar7 < lVar8 && ((-1 < in_R8D && (in_R8D < local_28)))))))) {
        local_30 = (double)(**(code **)(*(long *)in_RDI[2] + 0x48))
                                     ((long *)in_RDI[2],
                                      (long)(in_ECX + *(int *)((long)in_RDI + 0x44)),
                                      (long)(in_R8D + (int)in_RDI[9]));
        bVar3 = std::isfinite(local_30);
        if (bVar3) {
          ImageAdapterBase::setMinIntensity((ImageAdapterBase *)in_RDI[2],local_30);
          redrawImage(in_stack_fffffffffffffd70,(bool)uVar11);
          updateInfo((ImageWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        }
      }
    }
    break;
  case 'f':
    if (in_RDI[2] != 0) {
      BaseWindow::getSize(in_stack_fffffffffffffd60,
                          (int *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                          (int *)in_stack_fffffffffffffd50);
      uVar11 = (undefined1)((uint)in_stack_fffffffffffffd6c >> 0x18);
      iVar6 = (**(code **)(*(long *)in_RDI[2] + 0x58))();
      *(int *)((long)in_RDI + 0x44) = (iVar6 - local_20c) - *(int *)((long)in_RDI + 0x44);
      ImageAdapterBase::getRotation((ImageAdapterBase *)in_RDI[2]);
      ImageAdapterBase::getFlip((ImageAdapterBase *)in_RDI[2]);
      ImageAdapterBase::setRotationFlip
                (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0));
      redrawImage(in_stack_fffffffffffffd70,(bool)uVar11);
      updateInfo((ImageWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    break;
  case 'h':
    bVar3 = BaseWindow::hasInfoText((BaseWindow *)0x12016e);
    if (bVar3) {
      BaseWindow::setInfoText
                (&in_stack_fffffffffffffd70->super_BaseWindow,
                 (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    }
    else {
      std::__cxx11::string::c_str();
      BaseWindow::setInfoText
                (&in_stack_fffffffffffffd70->super_BaseWindow,
                 (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    }
    break;
  case 'i':
    *(byte *)((long)in_RDI + 0x54) = (*(byte *)((long)in_RDI + 0x54) ^ 0xff) & 1;
    updateInfo((ImageWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    break;
  case 'l':
    if (in_RDI[2] != 0) {
      in_stack_fffffffffffffe14 = *(int *)((long)in_RDI + 0x44);
      in_stack_fffffffffffffe10 = (int)in_RDI[9];
      BaseWindow::getSize(in_stack_fffffffffffffd60,
                          (int *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                          (int *)in_stack_fffffffffffffd50);
      uVar11 = (undefined1)((uint)in_stack_fffffffffffffd6c >> 0x18);
      bVar3 = ImageAdapterBase::getFlip((ImageAdapterBase *)in_RDI[2]);
      if (bVar3) {
        iVar6 = (**(code **)(*(long *)in_RDI[2] + 0x58))();
        in_stack_fffffffffffffe14 = (iVar6 - local_1f4) - in_stack_fffffffffffffe14;
      }
      *(int *)((long)in_RDI + 0x44) = (in_stack_fffffffffffffe10 + local_1f8 / 2) - local_1f4 / 2;
      iVar6 = (**(code **)(*(long *)in_RDI[2] + 0x58))();
      *(int *)(in_RDI + 9) =
           ((iVar6 + -1) - (in_stack_fffffffffffffe14 + local_1f4 / 2)) - local_1f8 / 2;
      bVar3 = ImageAdapterBase::getFlip((ImageAdapterBase *)in_RDI[2]);
      if (bVar3) {
        iVar6 = (**(code **)(*(long *)in_RDI[2] + 0x60))();
        *(int *)((long)in_RDI + 0x44) = (iVar6 - local_1f4) - *(int *)((long)in_RDI + 0x44);
      }
      this_00 = (ImageWindow *)in_RDI[2];
      ImageAdapterBase::getRotation((ImageAdapterBase *)in_RDI[2]);
      ImageAdapterBase::getFlip((ImageAdapterBase *)in_RDI[2]);
      ImageAdapterBase::setRotationFlip
                (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0));
      redrawImage(this_00,(bool)uVar11);
      updateInfo((ImageWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    break;
  case 'm':
    if (in_RDI[2] != 0) {
      mVar4 = ImageAdapterBase::getMapping((ImageAdapterBase *)in_RDI[2]);
      uVar11 = (undefined1)((uint)in_stack_fffffffffffffd6c >> 0x18);
      if (mVar4 == map_raw) {
        ImageAdapterBase::setMapping((ImageAdapterBase *)in_RDI[2],map_jet);
      }
      else if (mVar4 == map_jet) {
        ImageAdapterBase::setMapping((ImageAdapterBase *)in_RDI[2],map_rainbow);
      }
      else if (mVar4 == map_rainbow) {
        ImageAdapterBase::setMapping((ImageAdapterBase *)in_RDI[2],map_raw);
      }
      redrawImage(in_stack_fffffffffffffd70,(bool)uVar11);
    }
    break;
  case 'q':
    BaseWindow::sendClose
              ((BaseWindow *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    break;
  case 'r':
    if (in_RDI[2] != 0) {
      local_1fc = *(int *)((long)in_RDI + 0x44);
      iVar6 = (int)in_RDI[9];
      BaseWindow::getSize(in_stack_fffffffffffffd60,
                          (int *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                          (int *)in_stack_fffffffffffffd50);
      bVar3 = ImageAdapterBase::getFlip((ImageAdapterBase *)in_RDI[2]);
      if (bVar3) {
        iVar5 = (**(code **)(*(long *)in_RDI[2] + 0x58))();
        local_1fc = (iVar5 - local_204) - local_1fc;
      }
      iVar5 = (**(code **)(*(long *)in_RDI[2] + 0x60))();
      *(int *)((long)in_RDI + 0x44) = ((iVar5 + -1) - (iVar6 + local_208 / 2)) - local_204 / 2;
      *(int *)(in_RDI + 9) = (local_1fc + local_204 / 2) - local_208 / 2;
      bVar3 = ImageAdapterBase::getFlip((ImageAdapterBase *)in_RDI[2]);
      uVar11 = (undefined1)((uint)iVar6 >> 0x18);
      if (bVar3) {
        iVar6 = (**(code **)(*(long *)in_RDI[2] + 0x60))();
        *(int *)((long)in_RDI + 0x44) = (iVar6 - local_204) - *(int *)((long)in_RDI + 0x44);
      }
      ImageAdapterBase::getRotation((ImageAdapterBase *)in_RDI[2]);
      ImageAdapterBase::getFlip((ImageAdapterBase *)in_RDI[2]);
      ImageAdapterBase::setRotationFlip
                (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0));
      redrawImage(in_stack_fffffffffffffd70,(bool)uVar11);
      updateInfo((ImageWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    break;
  case 's':
    if (in_RDI[2] != 0) {
      (**(code **)(*(long *)in_RDI[2] + 0x58))();
      (**(code **)(*(long *)in_RDI[2] + 0x60))();
      BaseWindow::setSize(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                          in_stack_fffffffffffffd48);
    }
    break;
  case 't':
    if (in_RDI[2] != 0) {
      plVar1 = (long *)in_RDI[2];
      bVar2 = (**(code **)(*(long *)in_RDI[2] + 0x18))();
      uVar11 = (undefined1)((uint)in_stack_fffffffffffffd6c >> 0x18);
      (**(code **)(*plVar1 + 0x10))(plVar1,(bVar2 ^ 0xff) & 1);
      redrawImage(in_stack_fffffffffffffd70,(bool)uVar11);
      updateInfo((ImageWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    break;
  case 'v':
    bVar3 = BaseWindow::hasInfoText((BaseWindow *)0x1201bb);
    if (bVar3) {
      BaseWindow::setInfoText
                (&in_stack_fffffffffffffd70->super_BaseWindow,
                 (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar9 = std::operator<<((ostream *)local_1b8,"This program is based on cvkit version ");
      poVar9 = std::operator<<(poVar9,"2.6.17");
      std::operator<<(poVar9,"\n");
      std::operator<<((ostream *)local_1b8,"Copyright (C) 2016 - 2023 Roboception GmbH\n");
      std::operator<<((ostream *)local_1b8,
                      "Copyright (C) 2014, 2015 Institute of Robotics and Mechatronics, German Aerospace Center\n"
                     );
      std::operator<<((ostream *)local_1b8,"Author: Heiko Hirschmueller\n");
      std::operator<<((ostream *)local_1b8,"Contact: heiko.hirschmueller@roboception.de\n");
      std::operator<<((ostream *)local_1b8,"\n");
      std::operator<<((ostream *)local_1b8,
                      "This program is based in part on the work of the Independent JPEG Group.\n");
      pcVar10 = (char *)png_get_copyright(0);
      poVar9 = std::operator<<((ostream *)local_1b8,pcVar10);
      std::operator<<(poVar9,"\n");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::c_str();
      BaseWindow::setInfoText
                (&in_stack_fffffffffffffd70->super_BaseWindow,
                 (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
    }
    break;
  case 'w':
    if (in_RDI[2] != 0) {
      BaseWindow::getSize(in_stack_fffffffffffffd60,
                          (int *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                          (int *)in_stack_fffffffffffffd50);
      uVar11 = (undefined1)((uint)in_stack_fffffffffffffd6c >> 0x18);
      if (((((-1 < in_ECX + *(int *)((long)in_RDI + 0x44)) &&
            (iVar6 = *(int *)((long)in_RDI + 0x44),
            lVar7 = (**(code **)(*(long *)in_RDI[2] + 0x58))(), in_ECX + iVar6 < lVar7)) &&
           (-1 < in_ECX)) && ((in_ECX < local_34 && (-1 < in_R8D + (int)in_RDI[9])))) &&
         ((lVar7 = in_RDI[9], lVar8 = (**(code **)(*(long *)in_RDI[2] + 0x60))(),
          in_R8D + (int)lVar7 < lVar8 && ((-1 < in_R8D && (in_R8D < local_38)))))) {
        local_40 = (double)(**(code **)(*(long *)in_RDI[2] + 0x48))
                                     ((long *)in_RDI[2],
                                      (long)(in_ECX + *(int *)((long)in_RDI + 0x44)),
                                      (long)(in_R8D + (int)in_RDI[9]));
        bVar3 = std::isfinite(local_40);
        if (bVar3) {
          ImageAdapterBase::setMaxIntensity((ImageAdapterBase *)in_RDI[2],local_40);
          redrawImage(in_stack_fffffffffffffd70,(bool)uVar11);
          updateInfo((ImageWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        }
      }
    }
  }
  if (in_EDX == 1) {
    BaseWindow::sendClose
              ((BaseWindow *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  }
  return;
}

Assistant:

void ImageWindow::onKey(char c, SpecialKey key, int x, int y)
{
  lastkey=c;

  if (c != 'h' && c != 'v')
  {
    setInfoText("");
  }

  switch (c)
  {
    case '0':
      if (adapt != 0)
      {
        adapt->setScale(1);
        redrawImage();
        updateInfo();
      }

      break;

    case '1':
    case '2':
    case '4':
      if (adapt != 0)
      {
        adapt->setGamma(c-'1'+1);
        redrawImage();
        updateInfo();
      }

      break;

    case 'R':
      if (adapt != 0)
      {
        adapt->setChannel(0);
      }

      redrawImage();
      break;

    case 'G':
      if (adapt != 0)
      {
        adapt->setChannel(1);
      }

      redrawImage();
      break;

    case 'B':
      if (adapt != 0)
      {
        adapt->setChannel(2);
      }

      redrawImage();
      break;

    case 'C':
      if (adapt != 0)
      {
        adapt->setChannel(-1);
      }

      redrawImage();
      break;

    case '+':
      onMousePressed(button4, x, y, button4mask);
      break;

    case '-':
      onMousePressed(button5, x, y, button5mask);
      break;

    case 't':
      if (adapt != 0)
      {
        adapt->setSmoothing(!adapt->getSmoothing());
        redrawImage();
        updateInfo();
      }

      break;

    case 'a':
      if (adapt != 0)
      {
        int w, h;

        getSize(w, h);

        adapt->adaptMinMaxIntensity(imx, imy, w, h);
        redrawImage();
        updateInfo();
      }

      break;

    case 'b':
      if (adapt != 0)
      {
        int w, h;

        getSize(w, h);

        if (x+imx >= 0 && x+imx < adapt->getWidth() && x >= 0 && x < w
            && y+imy >= 0 && y+imy < adapt->getHeight() && y >= 0 && y < h)
        {
          double v=adapt->getIntensityOfPixel(x+imx, y+imy);

          if (std::isfinite(v))
          {
            adapt->setMinIntensity(v);
            redrawImage();
            updateInfo();
          }
        }
      }

      break;

    case 'w':
      if (adapt != 0)
      {
        int w, h;

        getSize(w, h);

        if (x+imx >= 0 && x+imx < adapt->getWidth() && x >= 0 && x < w
            && y+imy >= 0 && y+imy < adapt->getHeight() && y >= 0 && y < h)
        {
          double v=adapt->getIntensityOfPixel(x+imx, y+imy);

          if (std::isfinite(v))
          {
            adapt->setMaxIntensity(v);
            redrawImage();
            updateInfo();
          }
        }
      }

      break;

    case 'm':
      if (adapt != 0)
      {
        switch (adapt->getMapping())
        {
          case map_raw:
            adapt->setMapping(map_jet);
            break;

          case map_jet:
            adapt->setMapping(map_rainbow);
            break;

          case map_rainbow:
            adapt->setMapping(map_raw);
            break;
        }

        redrawImage();
      }

      break;

    case 'i':
      showinfo=!showinfo;
      updateInfo();
      break;

    case 'h':
      if (!hasInfoText())
      {
        setInfoText(helptext.c_str());
      }
      else
      {
        setInfoText("");
      }

      break;

    case 'v':
      if (!hasInfoText())
      {
        std::ostringstream out;

        out << "This program is based on cvkit version " << VERSION << "\n";
        out << "Copyright (C) 2016 - 2023 Roboception GmbH\n";
        out << "Copyright (C) 2014, 2015 Institute of Robotics and Mechatronics, German Aerospace Center\n";
        out << "Author: Heiko Hirschmueller\n";
        out << "Contact: heiko.hirschmueller@roboception.de\n";
#ifdef INCLUDE_GDAL
        out << "\n";
        out << "This program is based in part on the Geospatial Data Abstraction Library (GDAL).\n";
#endif
#if defined (INCLUDE_GDAL) || defined (INCLUDE_JPEG)
        out << "\n";
        out << "This program is based in part on the work of the Independent JPEG Group.\n";
#endif
#if defined (INCLUDE_PNG)
        out << png_get_copyright(0) << "\n";
#endif
        setInfoText(out.str().c_str());
      }
      else
      {
        setInfoText("");
      }

      break;

    case 's':
      if (adapt != 0)
      {
        setSize(adapt->getWidth(), adapt->getHeight());
      }

      break;

    case 'l':
      if (adapt != 0)
      {
        // rotation around center of image part

        int x=imx;
        int y=imy;
        int w, h;

        getSize(w, h);

        if (adapt->getFlip())
        {
          x=adapt->getWidth()-w-x;
        }

        imx=y+h/2-w/2;
        imy=adapt->getWidth()-1-(x+w/2)-h/2;

        if (adapt->getFlip())
        {
          imx=adapt->getHeight()-w-imx;
        }

        adapt->setRotationFlip(adapt->getRotation()-1, adapt->getFlip());

        redrawImage();
        updateInfo();
      }

      break;

    case 'r':
      if (adapt != 0)
      {
        // rotation around center of image part

        int x=imx;
        int y=imy;
        int w, h;

        getSize(w, h);

        if (adapt->getFlip())
        {
          x=adapt->getWidth()-w-x;
        }

        imx=adapt->getHeight()-1-(y+h/2)-w/2;
        imy=x+w/2-h/2;

        if (adapt->getFlip())
        {
          imx=adapt->getHeight()-w-imx;
        }

        adapt->setRotationFlip(adapt->getRotation()+1, adapt->getFlip());

        redrawImage();
        updateInfo();
      }

      break;

    case 'f':
      if (adapt != 0)
      {
        // flip at center of image part

        int w, h;

        getSize(w, h);

        imx=adapt->getWidth()-w-imx;

        adapt->setRotationFlip(adapt->getRotation(), !adapt->getFlip());

        redrawImage();
        updateInfo();
      }

      break;

    case 'q':
      sendClose();
      break;
  }

  if (key == k_esc)
  {
    sendClose();
  }
}